

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_glob.c
# Opt level: O0

void glob_version(t_pd *dummy,t_float f)

{
  t_float f_local;
  t_pd *dummy_local;
  
  if (0.531 < f) {
    if (glob_version::warned < 1) {
      post("warning: file format (%g) newer than this version (%g) of Pd",(double)f,
           0x3fe0f5c28f5c28f6);
    }
    else if (glob_version::warned < 2) {
      post("(... more file format messages suppressed)");
    }
    glob_version::warned = glob_version::warned + 1;
  }
  return;
}

Assistant:

static void glob_version(t_pd *dummy, t_float f)
{
    if (f > (PD_MAJOR_VERSION + 0.01*PD_MINOR_VERSION + 0.001))
    {
        static int warned;
        if (warned < 1)
            post("warning: file format (%g) newer than this version (%g) of Pd",
                f, PD_MAJOR_VERSION + 0.01*PD_MINOR_VERSION);
        else if (warned < 2)
            post("(... more file format messages suppressed)");
        warned++;
    }
}